

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiredOptsDouble_Test::~TApp_RequiredOptsDouble_Test(TApp_RequiredOptsDouble_Test *this)

{
  TApp_RequiredOptsDouble_Test *this_local;
  
  ~TApp_RequiredOptsDouble_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiredOptsDouble) {

    std::vector<std::string> strs;
    app.add_option("--str", strs)->required()->expected(2);

    args = {"--str", "one"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();
    args = {"--str", "one", "two"};

    run();

    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));
}